

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.h
# Opt level: O0

void alloc_token_info(AV1_COMMON *cm,TokenInfo *token_info,uint tokens_required)

{
  void *pvVar1;
  undefined4 in_EDX;
  undefined4 *in_RSI;
  size_t in_RDI;
  int sb_rows;
  
  *in_RSI = in_EDX;
  pvVar1 = aom_calloc(in_RDI,(size_t)in_RSI);
  *(void **)(in_RSI + 2) = pvVar1;
  if (*(long *)(in_RSI + 2) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate token_info->tile_tok[0][0]");
  }
  pvVar1 = aom_calloc(in_RDI,(size_t)in_RSI);
  *(void **)(in_RSI + 0x2002) = pvVar1;
  if (*(long *)(in_RSI + 0x2002) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate token_info->tplist[0][0]");
  }
  return;
}

Assistant:

static inline void alloc_token_info(AV1_COMMON *cm, TokenInfo *token_info,
                                    unsigned int tokens_required) {
  int sb_rows =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, cm->seq_params->mib_size_log2);
  token_info->tokens_allocated = tokens_required;

  CHECK_MEM_ERROR(cm, token_info->tile_tok[0][0],
                  (TokenExtra *)aom_calloc(
                      tokens_required, sizeof(*token_info->tile_tok[0][0])));

  CHECK_MEM_ERROR(
      cm, token_info->tplist[0][0],
      (TokenList *)aom_calloc(sb_rows * MAX_TILE_ROWS * MAX_TILE_COLS,
                              sizeof(*token_info->tplist[0][0])));
}